

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O1

bool __thiscall draco::PointCloudDecoder::DecodePointAttributes(PointCloudDecoder *this)

{
  long lVar1;
  DecoderBuffer *pDVar2;
  pointer puVar3;
  AttributesDecoderInterface *pAVar4;
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  _Var5;
  char cVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int i;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  *att_dec;
  pointer puVar13;
  
  pDVar2 = this->buffer_;
  lVar1 = pDVar2->pos_ + 1;
  if (lVar1 <= pDVar2->data_size_) {
    uVar10 = (uint)(byte)pDVar2->data_[pDVar2->pos_];
    pDVar2->pos_ = lVar1;
    if (uVar10 != 0) {
      uVar9 = 0;
      do {
        iVar7 = (*this->_vptr_PointCloudDecoder[4])(this,(ulong)uVar9);
        if ((char)iVar7 == '\0') {
          return false;
        }
        uVar9 = uVar9 + 1;
      } while (uVar10 != uVar9);
    }
    puVar3 = (this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar13 = (this->attributes_decoders_).
                   super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar3;
        puVar13 = puVar13 + 1) {
      pAVar4 = (puVar13->_M_t).
               super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
               .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl;
      iVar7 = (*pAVar4->_vptr_AttributesDecoderInterface[2])(pAVar4,this,this->point_cloud_);
      if ((char)iVar7 == '\0') {
        return false;
      }
    }
    if (uVar10 != 0) {
      uVar11 = 0;
      do {
        _Var5._M_t.
        super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
             (this->attributes_decoders_).
             super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
             super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
             ._M_t;
        cVar6 = (**(code **)(*(long *)_Var5._M_t.
                                      super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                      .
                                      super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                      ._M_head_impl + 0x18))
                          (_Var5._M_t.
                           super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                           .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                           _M_head_impl,this->buffer_);
        if (cVar6 == '\0') {
          return false;
        }
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
      uVar11 = 0;
      do {
        iVar7 = (**(code **)(*(long *)(this->attributes_decoders_).
                                      super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
                                      super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                                      ._M_t + 0x30))();
        if (0 < iVar7) {
          iVar12 = 0;
          do {
            _Var5._M_t.
            super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
            .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
                 (this->attributes_decoders_).
                 super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_t.
                 super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                 ._M_t;
            iVar8 = (**(code **)(*(long *)_Var5._M_t.
                                          super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                          .
                                          super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                          ._M_head_impl + 0x28))
                              (_Var5._M_t.
                               super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                               .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                               _M_head_impl,iVar12);
            if ((ulong)((long)(this->attribute_to_decoder_map_).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(this->attribute_to_decoder_map_).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2) <= (ulong)(long)iVar8) {
              std::vector<int,_std::allocator<int>_>::resize
                        (&this->attribute_to_decoder_map_,(long)(iVar8 + 1));
            }
            (this->attribute_to_decoder_map_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar8] = (int)uVar11;
            iVar12 = iVar12 + 1;
          } while (iVar7 != iVar12);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar10);
    }
    iVar7 = (*this->_vptr_PointCloudDecoder[7])(this);
    if ((char)iVar7 != '\0') {
      iVar7 = (*this->_vptr_PointCloudDecoder[8])(this);
      return SUB41(iVar7,0);
    }
  }
  return false;
}

Assistant:

bool PointCloudDecoder::DecodePointAttributes() {
  uint8_t num_attributes_decoders;
  if (!buffer_->Decode(&num_attributes_decoders)) {
    return false;
  }
  // Create all attribute decoders. This is implementation specific and the
  // derived classes can use any data encoded in the
  // PointCloudEncoder::EncodeAttributesEncoderIdentifier() call.
  for (int i = 0; i < num_attributes_decoders; ++i) {
    if (!CreateAttributesDecoder(i)) {
      return false;
    }
  }

  // Initialize all attributes decoders. No data is decoded here.
  for (auto &att_dec : attributes_decoders_) {
    if (!att_dec->Init(this, point_cloud_)) {
      return false;
    }
  }

  // Decode any data needed by the attribute decoders.
  for (int i = 0; i < num_attributes_decoders; ++i) {
    if (!attributes_decoders_[i]->DecodeAttributesDecoderData(buffer_)) {
      return false;
    }
  }

  // Create map between attribute and decoder ids.
  for (int i = 0; i < num_attributes_decoders; ++i) {
    const int32_t num_attributes = attributes_decoders_[i]->GetNumAttributes();
    for (int j = 0; j < num_attributes; ++j) {
      int att_id = attributes_decoders_[i]->GetAttributeId(j);
      if (att_id >= attribute_to_decoder_map_.size()) {
        attribute_to_decoder_map_.resize(att_id + 1);
      }
      attribute_to_decoder_map_[att_id] = i;
    }
  }

  // Decode the actual attributes using the created attribute decoders.
  if (!DecodeAllAttributes()) {
    return false;
  }

  if (!OnAttributesDecoded()) {
    return false;
  }
  return true;
}